

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev3dev.cpp
# Opt level: O1

bool ev3dev::button::process_all(void)

{
  bool bVar1;
  char *pcVar2;
  array<bool,_6UL> changed;
  char local_e;
  char local_d;
  char local_c;
  char local_b;
  char local_a;
  char local_9;
  
  local_e = process((button *)back);
  local_d = process((button *)left);
  local_c = process((button *)right);
  local_b = process((button *)up);
  local_a = process((button *)down);
  bVar1 = process((button *)enter);
  if (local_e == '\0') {
    if (local_d == '\0') {
      if (local_c == '\0') {
        if (local_b == '\0') {
          if (local_a == '\0') {
            pcVar2 = &local_9;
            if (!bVar1) {
              pcVar2 = &stack0xfffffffffffffff8;
            }
          }
          else {
            pcVar2 = &local_a;
          }
        }
        else {
          pcVar2 = &local_b;
        }
      }
      else {
        pcVar2 = &local_c;
      }
    }
    else {
      pcVar2 = &local_d;
    }
  }
  else {
    pcVar2 = &local_e;
  }
  return pcVar2 != &stack0xfffffffffffffff8;
}

Assistant:

bool button::process_all() {
    std::array<bool, 6> changed{{
        back. process(),
            left. process(),
            right.process(),
            up.   process(),
            down. process(),
            enter.process()
    }};
    return std::any_of(changed.begin(), changed.end(), [](bool c){ return c; });
}